

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_parse_function_generator.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::ParseFunctionGenerator::GenerateFieldBody
          (ParseFunctionGenerator *this,Formatter *format,WireType wiretype,FieldDescriptor *field)

{
  Options *pOVar1;
  bool bVar2;
  CppType CVar3;
  Type TVar4;
  OneofDescriptor *pOVar5;
  EnumDescriptor *this_00;
  LogMessage *other;
  CppType type_00;
  FieldDescriptor *pFVar6;
  AlphaNum *b;
  uint *options;
  FieldDescriptor *field_00;
  FieldDescriptor *field_01;
  FieldDescriptor *field_02;
  FieldDescriptor *field_03;
  long lVar7;
  char *pcVar8;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_00;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_01;
  allocator_type local_262;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_261;
  string size;
  string zigzag;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  string local_198;
  string type;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_138;
  AlphaNum local_f8;
  uint32_t tag;
  undefined4 uStack_c4;
  size_type sStack_c0;
  AlphaNum local_98;
  SaveState formatter_state;
  
  pFVar6 = field;
  Formatter::SaveState::SaveState(&formatter_state,format);
  type_00 = (CppType)pFVar6;
  FieldName_abi_cxx11_(&zigzag,(cpp *)field,field_00);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[5],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&type,(char (*) [5])0x3de831,&zigzag);
  pOVar1 = this->options_;
  CVar3 = FieldDescriptor::cpp_type(field);
  PrimitiveTypeName_abi_cxx11_((string *)&tag,(cpp *)pOVar1,(Options *)(ulong)CVar3,type_00);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[15],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_138,(char (*) [15])"primitive_type",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tag);
  b = &local_f8;
  __l._M_len = 2;
  __l._M_array = (iterator)&type;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)&size,__l,
        (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)b,
        (allocator_type *)&local_98);
  Formatter::AddMap(format,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&size);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&size);
  lVar7 = 0x40;
  do {
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)((long)&type._M_dataplus._M_p + lVar7));
    lVar7 = lVar7 + -0x40;
  } while (lVar7 != -0x40);
  std::__cxx11::string::~string((string *)&tag);
  std::__cxx11::string::~string((string *)&zigzag);
  if ((~(byte)field[1] & 0x60) == 0) {
    zigzag._M_dataplus._M_p = "add_";
    zigzag._M_string_length = 4;
    FieldName_abi_cxx11_(&local_1b8,(cpp *)field,field_01);
    _tag = local_1b8._M_dataplus._M_p;
    sStack_c0 = local_1b8._M_string_length;
    StrCat_abi_cxx11_(&local_198,(protobuf *)&zigzag,(AlphaNum *)&tag,b);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[10],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&type,(char (*) [10])"put_field",&local_198);
    local_f8.piece_data_ = "add_";
    local_f8.piece_size_ = 4;
    FieldName_abi_cxx11_(&local_1f8,(cpp *)field,field_02);
    local_98.piece_data_ = local_1f8._M_dataplus._M_p;
    local_98.piece_size_ = local_1f8._M_string_length;
    StrCat_abi_cxx11_(&local_1d8,(protobuf *)&local_f8,&local_98,b);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[14],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (&local_138,(char (*) [14])"mutable_field",&local_1d8);
    __l_00._M_len = 2;
    __l_00._M_array = (iterator)&type;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)&size,__l_00,&local_261,&local_262);
    Formatter::AddMap(format,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&size);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&size);
    lVar7 = 0x40;
    do {
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)((long)&type._M_dataplus._M_p + lVar7));
      lVar7 = lVar7 + -0x40;
    } while (lVar7 != -0x40);
  }
  else {
    zigzag._M_dataplus._M_p = "set_";
    zigzag._M_string_length = 4;
    FieldName_abi_cxx11_(&local_1b8,(cpp *)field,field_01);
    _tag = local_1b8._M_dataplus._M_p;
    sStack_c0 = local_1b8._M_string_length;
    StrCat_abi_cxx11_(&local_198,(protobuf *)&zigzag,(AlphaNum *)&tag,b);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[10],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&type,(char (*) [10])"put_field",&local_198);
    local_f8.piece_data_ = "mutable_";
    local_f8.piece_size_ = 8;
    FieldName_abi_cxx11_(&local_1f8,(cpp *)field,field_03);
    local_98.piece_data_ = local_1f8._M_dataplus._M_p;
    local_98.piece_size_ = local_1f8._M_string_length;
    StrCat_abi_cxx11_(&local_1d8,(protobuf *)&local_f8,&local_98,b);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[14],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (&local_138,(char (*) [14])"mutable_field",&local_1d8);
    __l_01._M_len = 2;
    __l_01._M_array = (iterator)&type;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)&size,__l_01,&local_261,&local_262);
    Formatter::AddMap(format,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&size);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&size);
    lVar7 = 0x40;
    do {
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)((long)&type._M_dataplus._M_p + lVar7));
      lVar7 = lVar7 + -0x40;
    } while (lVar7 != -0x40);
  }
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_1b8);
  tag = *(int *)(field + 4) << 3 | wiretype;
  options = &switchD_002e7c56::switchdataD_003ec4f0;
  switch(wiretype) {
  case WIRETYPE_VARINT:
    pOVar1 = this->options_;
    CVar3 = FieldDescriptor::cpp_type(field);
    PrimitiveTypeName_abi_cxx11_(&type,(cpp *)pOVar1,(Options *)(ulong)CVar3,(CppType)options);
    TVar4 = FieldDescriptor::type(field);
    if (TVar4 == TYPE_ENUM) {
      std::__cxx11::string::string((string *)&size,"enum_type",(allocator *)&local_f8);
      this_00 = FieldDescriptor::enum_type(field);
      QualifiedClassName_abi_cxx11_
                (&zigzag,(cpp *)this_00,(EnumDescriptor *)this->options_,(Options *)options);
      Formatter::Set<std::__cxx11::string>(format,&size,&zigzag);
      std::__cxx11::string::~string((string *)&zigzag);
      std::__cxx11::string::~string((string *)&size);
      Formatter::operator()<>
                (format,"$uint64$ val = ::$proto_ns$::internal::ReadVarint64(&ptr);\nCHK_(ptr);\n");
      if (*(char *)(*(long *)(field + 0x10) + 0x3a) != '\x03') {
        Formatter::operator()<>(format,"if (PROTOBUF_PREDICT_TRUE($enum_type$_IsValid(val))) {\n");
        Formatter::Indent(format);
      }
      Formatter::operator()<>(format,"$msg$_internal_$put_field$(static_cast<$enum_type$>(val));\n")
      ;
      if (*(char *)(*(long *)(field + 0x10) + 0x3a) != '\x03') {
        Formatter::Outdent(format);
        size._M_dataplus._M_p._0_4_ = *(undefined4 *)(field + 4);
        Formatter::operator()
                  (format,
                   "} else {\n  ::$proto_ns$::internal::WriteVarint($1$, val, $msg$mutable_unknown_fields());\n}\n"
                   ,(int *)&size);
      }
    }
    else {
      TVar4 = FieldDescriptor::type(field);
      pcVar8 = "32";
      if ((TVar4 != TYPE_INT32) && (TVar4 = FieldDescriptor::type(field), TVar4 != TYPE_SINT32)) {
        TVar4 = FieldDescriptor::type(field);
        pcVar8 = "64";
        if (TVar4 == TYPE_UINT32) {
          pcVar8 = "32";
        }
      }
      std::__cxx11::string::string((string *)&size,pcVar8,(allocator *)&zigzag);
      zigzag._M_dataplus._M_p = (pointer)&zigzag.field_2;
      zigzag._M_string_length = 0;
      zigzag.field_2._M_local_buf[0] = '\0';
      TVar4 = FieldDescriptor::type(field);
      if ((TVar4 == TYPE_SINT32) || (TVar4 = FieldDescriptor::type(field), TVar4 == MAX_TYPE)) {
        std::__cxx11::string::assign((char *)&zigzag);
      }
      pcVar8 = 
      "$msg$_internal_$put_field$(::$proto_ns$::internal::ReadVarint$1$$2$(&ptr));\nCHK_(ptr);\n";
      if (((~(byte)field[1] & 0x60) != 0) &&
         (pOVar5 = FieldDescriptor::real_containing_oneof(field), pOVar5 == (OneofDescriptor *)0x0))
      {
        bVar2 = HasHasbit(field);
        pcVar8 = "$msg$$name$_ = ::$proto_ns$::internal::ReadVarint$1$$2$(&ptr);\nCHK_(ptr);\n";
        if (bVar2) {
          Formatter::operator()<>(format,"_Internal::set_has_$name$(&$has_bits$);\n");
        }
      }
      Formatter::operator()(format,pcVar8,&zigzag,&size);
      std::__cxx11::string::~string((string *)&zigzag);
      std::__cxx11::string::~string((string *)&size);
    }
    std::__cxx11::string::~string((string *)&type);
    break;
  case WIRETYPE_FIXED64:
  case WIRETYPE_FIXED32:
    pcVar8 = 
    "$msg$_internal_$put_field$(::$proto_ns$::internal::UnalignedLoad<$primitive_type$>(ptr));\nptr += sizeof($primitive_type$);\n"
    ;
    if (((~(byte)field[1] & 0x60) != 0) &&
       (pOVar5 = FieldDescriptor::real_containing_oneof(field), pOVar5 == (OneofDescriptor *)0x0)) {
      bVar2 = HasHasbit(field);
      pcVar8 = 
      "$msg$$name$_ = ::$proto_ns$::internal::UnalignedLoad<$primitive_type$>(ptr);\nptr += sizeof($primitive_type$);\n"
      ;
      if (bVar2) {
        Formatter::operator()<>(format,"_Internal::set_has_$name$(&$has_bits$);\n");
      }
    }
    goto LAB_002e7cac;
  case WIRETYPE_LENGTH_DELIMITED:
    GenerateLengthDelim(this,format,field);
    pcVar8 = "CHK_(ptr);\n";
LAB_002e7cac:
    Formatter::operator()<>(format,pcVar8);
    break;
  case WIRETYPE_START_GROUP:
    Formatter::operator()
              (format,
               "ptr = ctx->ParseGroup($msg$_internal_$mutable_field$(), ptr, $1$);\nCHK_(ptr);\n",
               &tag);
    break;
  case WIRETYPE_END_GROUP:
    internal::LogMessage::LogMessage
              ((LogMessage *)&type,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_parse_function_generator.cc"
               ,0x3ab);
    other = internal::LogMessage::operator<<((LogMessage *)&type,"Can\'t have end group field\n");
    internal::LogFinisher::operator=((LogFinisher *)&size,other);
    internal::LogMessage::~LogMessage((LogMessage *)&type);
  }
  Formatter::SaveState::~SaveState(&formatter_state);
  return;
}

Assistant:

void ParseFunctionGenerator::GenerateFieldBody(
    Formatter& format, WireFormatLite::WireType wiretype,
    const FieldDescriptor* field) {
  Formatter::SaveState formatter_state(&format);
  format.AddMap(
      {{"name", FieldName(field)},
       {"primitive_type", PrimitiveTypeName(options_, field->cpp_type())}});
  if (field->is_repeated()) {
    format.AddMap({{"put_field", StrCat("add_", FieldName(field))},
                   {"mutable_field", StrCat("add_", FieldName(field))}});
  } else {
    format.AddMap(
        {{"put_field", StrCat("set_", FieldName(field))},
         {"mutable_field", StrCat("mutable_", FieldName(field))}});
  }
  uint32_t tag = WireFormatLite::MakeTag(field->number(), wiretype);
  switch (wiretype) {
    case WireFormatLite::WIRETYPE_VARINT: {
      std::string type = PrimitiveTypeName(options_, field->cpp_type());
      if (field->type() == FieldDescriptor::TYPE_ENUM) {
        format.Set("enum_type",
                   QualifiedClassName(field->enum_type(), options_));
        format(
            "$uint64$ val = ::$proto_ns$::internal::ReadVarint64(&ptr);\n"
            "CHK_(ptr);\n");
        if (!HasPreservingUnknownEnumSemantics(field)) {
          format("if (PROTOBUF_PREDICT_TRUE($enum_type$_IsValid(val))) {\n");
          format.Indent();
        }
        format("$msg$_internal_$put_field$(static_cast<$enum_type$>(val));\n");
        if (!HasPreservingUnknownEnumSemantics(field)) {
          format.Outdent();
          format(
              "} else {\n"
              "  ::$proto_ns$::internal::WriteVarint("
              "$1$, val, $msg$mutable_unknown_fields());\n"
              "}\n",
              field->number());
        }
      } else {
        std::string size = (field->type() == FieldDescriptor::TYPE_INT32 ||
                            field->type() == FieldDescriptor::TYPE_SINT32 ||
                            field->type() == FieldDescriptor::TYPE_UINT32)
                               ? "32"
                               : "64";
        std::string zigzag;
        if ((field->type() == FieldDescriptor::TYPE_SINT32 ||
             field->type() == FieldDescriptor::TYPE_SINT64)) {
          zigzag = "ZigZag";
        }
        if (field->is_repeated() || field->real_containing_oneof()) {
          format(
              "$msg$_internal_$put_field$("
              "::$proto_ns$::internal::ReadVarint$1$$2$(&ptr));\n"
              "CHK_(ptr);\n",
              zigzag, size);
        } else {
          if (HasHasbit(field)) {
            format("_Internal::set_has_$name$(&$has_bits$);\n");
          }
          format(
              "$msg$$name$_ = ::$proto_ns$::internal::ReadVarint$1$$2$(&ptr);\n"
              "CHK_(ptr);\n",
              zigzag, size);
        }
      }
      break;
    }
    case WireFormatLite::WIRETYPE_FIXED32:
    case WireFormatLite::WIRETYPE_FIXED64: {
      if (field->is_repeated() || field->real_containing_oneof()) {
        format(
            "$msg$_internal_$put_field$("
            "::$proto_ns$::internal::UnalignedLoad<$primitive_type$>(ptr));\n"
            "ptr += sizeof($primitive_type$);\n");
      } else {
        if (HasHasbit(field)) {
          format("_Internal::set_has_$name$(&$has_bits$);\n");
        }
        format(
            "$msg$$name$_ = "
            "::$proto_ns$::internal::UnalignedLoad<$primitive_type$>(ptr);\n"
            "ptr += sizeof($primitive_type$);\n");
      }
      break;
    }
    case WireFormatLite::WIRETYPE_LENGTH_DELIMITED: {
      GenerateLengthDelim(format, field);
      format("CHK_(ptr);\n");
      break;
    }
    case WireFormatLite::WIRETYPE_START_GROUP: {
      format(
          "ptr = ctx->ParseGroup($msg$_internal_$mutable_field$(), ptr, $1$);\n"
          "CHK_(ptr);\n",
          tag);
      break;
    }
    case WireFormatLite::WIRETYPE_END_GROUP: {
      GOOGLE_LOG(FATAL) << "Can't have end group field\n";
      break;
    }
  }  // switch (wire_type)
}